

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

bool embree::sse42::
     BVHNIntersector1<4,_16777232,_true,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMiMBIntersector1Pluecker<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  ulong uVar2;
  undefined8 uVar3;
  Geometry *this;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined1 (*pauVar8) [16];
  bool bVar9;
  bool bVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  byte bVar14;
  size_t i;
  long lVar15;
  long lVar16;
  undefined1 (*pauVar17) [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  float fVar45;
  float fVar46;
  undefined1 auVar41 [16];
  float fVar47;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar54;
  float fVar56;
  float fVar57;
  undefined1 auVar55 [16];
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1018 [8];
  float fStack_1010;
  float fStack_100c;
  undefined1 local_1008 [8];
  float fStack_1000;
  float fStack_ffc;
  undefined1 local_ff8 [8];
  float fStack_ff0;
  float fStack_fec;
  float local_fe8 [4];
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [16];
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  undefined8 local_f98;
  float fStack_f90;
  float fStack_f8c;
  long local_f88;
  ulong local_f80;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 == 8) {
    return false;
  }
  uStack_f70 = 0;
  local_ff8._4_4_ = (query->p).field_0.field_0.x;
  local_1008._4_4_ = (query->p).field_0.field_0.y;
  local_1018._4_4_ = (query->p).field_0.field_0.z;
  local_fa8 = (context->query_radius).field_0.m128[0];
  fStack_fc4 = *(float *)((long)&(context->query_radius).field_0 + 4);
  fStack_fd4 = *(float *)((long)&(context->query_radius).field_0 + 8);
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_fb8 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar1 = (context->query_radius).field_0;
    local_fb8 = dpps((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
  }
  pauVar17 = (undefined1 (*) [16])local_f68;
  local_ff8._0_4_ = local_ff8._4_4_;
  fStack_ff0 = (float)local_ff8._4_4_;
  fStack_fec = (float)local_ff8._4_4_;
  local_1008._0_4_ = local_1008._4_4_;
  fStack_1000 = (float)local_1008._4_4_;
  fStack_ffc = (float)local_1008._4_4_;
  local_1018._0_4_ = local_1018._4_4_;
  fStack_1010 = (float)local_1018._4_4_;
  fStack_100c = (float)local_1018._4_4_;
  local_fc8 = fStack_fc4;
  fStack_fc0 = fStack_fc4;
  fStack_fbc = fStack_fc4;
  local_fd8 = fStack_fd4;
  fStack_fd0 = fStack_fd4;
  fStack_fcc = fStack_fd4;
  fVar27 = local_fa8 * local_fa8;
  bVar10 = false;
  fStack_fa4 = local_fa8;
  fStack_fa0 = local_fa8;
  fStack_f9c = local_fa8;
  fVar28 = fVar27;
  fVar29 = fVar27;
  fVar30 = fVar27;
LAB_00d96c9c:
  local_f98 = CONCAT44((float)local_ff8._4_4_ - fStack_fa4,(float)local_ff8._4_4_ - local_fa8);
  fStack_f90 = (float)local_ff8._4_4_ - fStack_fa0;
  fStack_f8c = (float)local_ff8._4_4_ - fStack_f9c;
  while( true ) {
    pauVar8 = pauVar17 + -1;
    pauVar17 = pauVar17 + -1;
    if ((float)local_fb8._0_4_ < *(float *)((long)*pauVar8 + 8)) break;
    uVar12 = *(ulong *)*pauVar17;
LAB_00d96cf8:
    uVar13 = (uint)uVar12;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      if ((uVar12 & 8) != 0) {
LAB_00d971a1:
        local_f88 = (ulong)(uVar13 & 0xf) - 8;
        if (local_f88 == 0) break;
        lVar16 = (uVar12 & 0xfffffffffffffff0) + 0x40;
        local_f98 = 0;
        uVar12 = 0;
        goto LAB_00d971c5;
      }
      uVar11 = uVar12 & 0xfffffffffffffff0;
      fVar40 = query->time;
      auVar33._4_4_ = fVar40;
      auVar33._0_4_ = fVar40;
      auVar33._8_4_ = fVar40;
      auVar33._12_4_ = fVar40;
      auVar31._0_4_ = *(float *)(uVar11 + 0x80) * fVar40 + *(float *)(uVar11 + 0x20);
      auVar31._4_4_ = *(float *)(uVar11 + 0x84) * fVar40 + *(float *)(uVar11 + 0x24);
      auVar31._8_4_ = *(float *)(uVar11 + 0x88) * fVar40 + *(float *)(uVar11 + 0x28);
      auVar31._12_4_ = *(float *)(uVar11 + 0x8c) * fVar40 + *(float *)(uVar11 + 0x2c);
      auVar41._0_4_ = *(float *)(uVar11 + 0xa0) * fVar40 + *(float *)(uVar11 + 0x40);
      auVar41._4_4_ = *(float *)(uVar11 + 0xa4) * fVar40 + *(float *)(uVar11 + 0x44);
      auVar41._8_4_ = *(float *)(uVar11 + 0xa8) * fVar40 + *(float *)(uVar11 + 0x48);
      auVar41._12_4_ = *(float *)(uVar11 + 0xac) * fVar40 + *(float *)(uVar11 + 0x4c);
      auVar36._0_4_ = *(float *)(uVar11 + 0xc0) * fVar40 + *(float *)(uVar11 + 0x60);
      auVar36._4_4_ = *(float *)(uVar11 + 0xc4) * fVar40 + *(float *)(uVar11 + 100);
      auVar36._8_4_ = *(float *)(uVar11 + 200) * fVar40 + *(float *)(uVar11 + 0x68);
      auVar36._12_4_ = *(float *)(uVar11 + 0xcc) * fVar40 + *(float *)(uVar11 + 0x6c);
      auVar34._0_4_ = *(float *)(uVar11 + 0x90) * fVar40 + *(float *)(uVar11 + 0x30);
      auVar34._4_4_ = *(float *)(uVar11 + 0x94) * fVar40 + *(float *)(uVar11 + 0x34);
      auVar34._8_4_ = *(float *)(uVar11 + 0x98) * fVar40 + *(float *)(uVar11 + 0x38);
      auVar34._12_4_ = *(float *)(uVar11 + 0x9c) * fVar40 + *(float *)(uVar11 + 0x3c);
      auVar48._0_4_ = *(float *)(uVar11 + 0xb0) * fVar40 + *(float *)(uVar11 + 0x50);
      auVar48._4_4_ = *(float *)(uVar11 + 0xb4) * fVar40 + *(float *)(uVar11 + 0x54);
      auVar48._8_4_ = *(float *)(uVar11 + 0xb8) * fVar40 + *(float *)(uVar11 + 0x58);
      auVar48._12_4_ = *(float *)(uVar11 + 0xbc) * fVar40 + *(float *)(uVar11 + 0x5c);
      auVar52._0_4_ = *(float *)(uVar11 + 0xd0) * fVar40 + *(float *)(uVar11 + 0x70);
      auVar52._4_4_ = *(float *)(uVar11 + 0xd4) * fVar40 + *(float *)(uVar11 + 0x74);
      auVar52._8_4_ = *(float *)(uVar11 + 0xd8) * fVar40 + *(float *)(uVar11 + 0x78);
      auVar52._12_4_ = *(float *)(uVar11 + 0xdc) * fVar40 + *(float *)(uVar11 + 0x7c);
      auVar55 = maxps(_local_ff8,auVar31);
      auVar55 = minps(auVar55,auVar34);
      fVar54 = auVar55._0_4_ - (float)local_ff8._4_4_;
      fVar56 = auVar55._4_4_ - (float)local_ff8._4_4_;
      fVar57 = auVar55._8_4_ - (float)local_ff8._4_4_;
      fVar58 = auVar55._12_4_ - (float)local_ff8._4_4_;
      auVar55 = maxps(_local_1008,auVar41);
      auVar55 = minps(auVar55,auVar48);
      fVar59 = auVar55._0_4_ - (float)local_1008._4_4_;
      fVar60 = auVar55._4_4_ - (float)local_1008._4_4_;
      fVar61 = auVar55._8_4_ - (float)local_1008._4_4_;
      fVar62 = auVar55._12_4_ - (float)local_1008._4_4_;
      auVar55 = maxps(_local_1018,auVar36);
      auVar55 = minps(auVar55,auVar52);
      fVar40 = auVar55._0_4_ - (float)local_1018._4_4_;
      fVar45 = auVar55._4_4_ - (float)local_1018._4_4_;
      fVar46 = auVar55._8_4_ - (float)local_1018._4_4_;
      fVar47 = auVar55._12_4_ - (float)local_1018._4_4_;
      local_fe8[0] = fVar40 * fVar40 + fVar59 * fVar59 + fVar54 * fVar54;
      local_fe8[1] = fVar45 * fVar45 + fVar60 * fVar60 + fVar56 * fVar56;
      local_fe8[2] = fVar46 * fVar46 + fVar61 * fVar61 + fVar57 * fVar57;
      local_fe8[3] = fVar47 * fVar47 + fVar62 * fVar62 + fVar58 * fVar58;
      auVar39._0_4_ = -(uint)(auVar31._0_4_ <= auVar34._0_4_ && local_fe8[0] <= fVar27);
      auVar39._4_4_ = -(uint)(auVar31._4_4_ <= auVar34._4_4_ && local_fe8[1] <= fVar28);
      auVar39._8_4_ = -(uint)(auVar31._8_4_ <= auVar34._8_4_ && local_fe8[2] <= fVar29);
      auVar39._12_4_ = -(uint)(auVar31._12_4_ <= auVar34._12_4_ && local_fe8[3] <= fVar30);
      if ((uVar13 & 7) != 6) goto LAB_00d96dfa;
LAB_00d96f77:
      uVar11 = uVar12 & 0xfffffffffffffff0;
      auVar18._0_4_ =
           (-(uint)(auVar33._0_4_ < *(float *)(uVar11 + 0xf0) &&
                   *(float *)(uVar11 + 0xe0) <= auVar33._0_4_) & auVar39._0_4_) << 0x1f;
      auVar18._4_4_ =
           (-(uint)(auVar33._4_4_ < *(float *)(uVar11 + 0xf4) &&
                   *(float *)(uVar11 + 0xe4) <= auVar33._4_4_) & auVar39._4_4_) << 0x1f;
      auVar18._8_4_ =
           (-(uint)(auVar33._8_4_ < *(float *)(uVar11 + 0xf8) &&
                   *(float *)(uVar11 + 0xe8) <= auVar33._8_4_) & auVar39._8_4_) << 0x1f;
      auVar18._12_4_ =
           (-(uint)(auVar33._12_4_ < *(float *)(uVar11 + 0xfc) &&
                   *(float *)(uVar11 + 0xec) <= auVar33._12_4_) & auVar39._12_4_) << 0x1f;
      uVar13 = movmskps(uVar13 & 7,auVar18);
    }
    else {
      if ((uVar12 & 8) != 0) goto LAB_00d971a1;
      uVar11 = uVar12 & 0xfffffffffffffff0;
      fVar40 = query->time;
      auVar33._4_4_ = fVar40;
      auVar33._0_4_ = fVar40;
      auVar33._8_4_ = fVar40;
      auVar33._12_4_ = fVar40;
      auVar51._0_4_ = *(float *)(uVar11 + 0x80) * fVar40 + *(float *)(uVar11 + 0x20);
      auVar51._4_4_ = *(float *)(uVar11 + 0x84) * fVar40 + *(float *)(uVar11 + 0x24);
      auVar51._8_4_ = *(float *)(uVar11 + 0x88) * fVar40 + *(float *)(uVar11 + 0x28);
      auVar51._12_4_ = *(float *)(uVar11 + 0x8c) * fVar40 + *(float *)(uVar11 + 0x2c);
      auVar44._0_4_ = *(float *)(uVar11 + 0xa0) * fVar40 + *(float *)(uVar11 + 0x40);
      auVar44._4_4_ = *(float *)(uVar11 + 0xa4) * fVar40 + *(float *)(uVar11 + 0x44);
      auVar44._8_4_ = *(float *)(uVar11 + 0xa8) * fVar40 + *(float *)(uVar11 + 0x48);
      auVar44._12_4_ = *(float *)(uVar11 + 0xac) * fVar40 + *(float *)(uVar11 + 0x4c);
      auVar55._0_4_ = *(float *)(uVar11 + 0xc0) * fVar40 + *(float *)(uVar11 + 0x60);
      auVar55._4_4_ = *(float *)(uVar11 + 0xc4) * fVar40 + *(float *)(uVar11 + 100);
      auVar55._8_4_ = *(float *)(uVar11 + 200) * fVar40 + *(float *)(uVar11 + 0x68);
      auVar55._12_4_ = *(float *)(uVar11 + 0xcc) * fVar40 + *(float *)(uVar11 + 0x6c);
      auVar42._0_4_ = *(float *)(uVar11 + 0x90) * fVar40 + *(float *)(uVar11 + 0x30);
      auVar42._4_4_ = *(float *)(uVar11 + 0x94) * fVar40 + *(float *)(uVar11 + 0x34);
      auVar42._8_4_ = *(float *)(uVar11 + 0x98) * fVar40 + *(float *)(uVar11 + 0x38);
      auVar42._12_4_ = *(float *)(uVar11 + 0x9c) * fVar40 + *(float *)(uVar11 + 0x3c);
      auVar53._0_4_ = *(float *)(uVar11 + 0xb0) * fVar40 + *(float *)(uVar11 + 0x50);
      auVar53._4_4_ = *(float *)(uVar11 + 0xb4) * fVar40 + *(float *)(uVar11 + 0x54);
      auVar53._8_4_ = *(float *)(uVar11 + 0xb8) * fVar40 + *(float *)(uVar11 + 0x58);
      auVar53._12_4_ = *(float *)(uVar11 + 0xbc) * fVar40 + *(float *)(uVar11 + 0x5c);
      auVar49._0_4_ = *(float *)(uVar11 + 0xd0) * fVar40 + *(float *)(uVar11 + 0x70);
      auVar49._4_4_ = *(float *)(uVar11 + 0xd4) * fVar40 + *(float *)(uVar11 + 0x74);
      auVar49._8_4_ = *(float *)(uVar11 + 0xd8) * fVar40 + *(float *)(uVar11 + 0x78);
      auVar49._12_4_ = *(float *)(uVar11 + 0xdc) * fVar40 + *(float *)(uVar11 + 0x7c);
      auVar39 = maxps(_local_ff8,auVar51);
      auVar39 = minps(auVar39,auVar42);
      fVar40 = auVar39._0_4_ - (float)local_ff8._4_4_;
      fVar46 = auVar39._4_4_ - (float)local_ff8._4_4_;
      fVar54 = auVar39._8_4_ - (float)local_ff8._4_4_;
      fVar57 = auVar39._12_4_ - (float)local_ff8._4_4_;
      auVar39 = maxps(_local_1008,auVar44);
      auVar39 = minps(auVar39,auVar53);
      fVar59 = auVar39._0_4_ - (float)local_1008._4_4_;
      fVar60 = auVar39._4_4_ - (float)local_1008._4_4_;
      fVar61 = auVar39._8_4_ - (float)local_1008._4_4_;
      fVar62 = auVar39._12_4_ - (float)local_1008._4_4_;
      auVar39 = maxps(_local_1018,auVar55);
      auVar39 = minps(auVar39,auVar49);
      fVar45 = auVar39._0_4_ - (float)local_1018._4_4_;
      fVar47 = auVar39._4_4_ - (float)local_1018._4_4_;
      fVar56 = auVar39._8_4_ - (float)local_1018._4_4_;
      fVar58 = auVar39._12_4_ - (float)local_1018._4_4_;
      local_fe8[0] = fVar45 * fVar45 + fVar59 * fVar59 + fVar40 * fVar40;
      local_fe8[1] = fVar47 * fVar47 + fVar60 * fVar60 + fVar46 * fVar46;
      local_fe8[2] = fVar56 * fVar56 + fVar61 * fVar61 + fVar54 * fVar54;
      local_fe8[3] = fVar58 * fVar58 + fVar62 * fVar62 + fVar57 * fVar57;
      uVar6 = (uint)(((auVar55._0_4_ <= (float)local_1018._4_4_ + local_fd8 &&
                      (float)local_ff8._4_4_ - local_fa8 <= auVar42._0_4_) &&
                     (auVar44._0_4_ <= (float)local_1008._4_4_ + local_fc8 &&
                     auVar51._0_4_ <= (float)local_ff8._4_4_ + local_fa8)) &&
                    ((float)local_1018._4_4_ - local_fd8 <= auVar49._0_4_ &&
                    ((float)local_1008._4_4_ - local_fc8 <= auVar53._0_4_ &&
                    auVar51._0_4_ <= auVar42._0_4_)));
      auVar39._0_4_ = -uVar6;
      uVar7 = (uint)(((auVar55._4_4_ <= (float)local_1018._4_4_ + fStack_fd4 &&
                      (float)local_ff8._4_4_ - fStack_fa4 <= auVar42._4_4_) &&
                     (auVar44._4_4_ <= (float)local_1008._4_4_ + fStack_fc4 &&
                     auVar51._4_4_ <= (float)local_ff8._4_4_ + fStack_fa4)) &&
                    ((float)local_1018._4_4_ - fStack_fd4 <= auVar49._4_4_ &&
                    ((float)local_1008._4_4_ - fStack_fc4 <= auVar53._4_4_ &&
                    auVar51._4_4_ <= auVar42._4_4_)));
      auVar39._4_4_ = -uVar7;
      uVar5 = (uint)(((auVar55._8_4_ <= (float)local_1018._4_4_ + fStack_fd0 &&
                      (float)local_ff8._4_4_ - fStack_fa0 <= auVar42._8_4_) &&
                     (auVar44._8_4_ <= (float)local_1008._4_4_ + fStack_fc0 &&
                     auVar51._8_4_ <= (float)local_ff8._4_4_ + fStack_fa0)) &&
                    ((float)local_1018._4_4_ - fStack_fd0 <= auVar49._8_4_ &&
                    ((float)local_1008._4_4_ - fStack_fc0 <= auVar53._8_4_ &&
                    auVar51._8_4_ <= auVar42._8_4_)));
      auVar39._8_4_ = -uVar5;
      uVar4 = (uint)(((auVar55._12_4_ <= (float)local_1018._4_4_ + fStack_fcc &&
                      (float)local_ff8._4_4_ - fStack_f9c <= auVar42._12_4_) &&
                     (auVar44._12_4_ <= (float)local_1008._4_4_ + fStack_fbc &&
                     auVar51._12_4_ <= (float)local_ff8._4_4_ + fStack_f9c)) &&
                    ((float)local_1018._4_4_ - fStack_fcc <= auVar49._12_4_ &&
                    ((float)local_1008._4_4_ - fStack_fbc <= auVar53._12_4_ &&
                    auVar51._12_4_ <= auVar42._12_4_)));
      auVar39._12_4_ = -uVar4;
      if ((uVar13 & 7) == 6) goto LAB_00d96f77;
      auVar39._0_4_ = uVar6 * -0x80000000;
      auVar39._4_4_ = uVar7 * -0x80000000;
      auVar39._8_4_ = uVar5 * -0x80000000;
      auVar39._12_4_ = uVar4 * -0x80000000;
LAB_00d96dfa:
      uVar13 = movmskps(uVar13 & 7,auVar39);
    }
    if (uVar13 != 0) {
      uVar11 = uVar12 & 0xfffffffffffffff0;
      lVar16 = 0;
      if (uVar13 != 0) {
        for (; (uVar13 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
        }
      }
      uVar12 = *(ulong *)(uVar11 + lVar16 * 8);
      uVar13 = uVar13 - 1 & uVar13;
      if (uVar13 != 0) {
        fVar40 = local_fe8[lVar16];
        lVar16 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
          }
        }
        uVar2 = *(ulong *)(uVar11 + lVar16 * 8);
        fVar45 = local_fe8[lVar16];
        uVar13 = uVar13 - 1 & uVar13;
        if (uVar13 == 0) {
          if ((uint)fVar40 < (uint)fVar45) {
            *(ulong *)*pauVar17 = uVar2;
            *(float *)((long)*pauVar17 + 8) = fVar45;
            pauVar17 = pauVar17 + 1;
          }
          else {
            *(ulong *)*pauVar17 = uVar12;
            *(float *)((long)*pauVar17 + 8) = fVar40;
            uVar12 = uVar2;
            pauVar17 = pauVar17 + 1;
          }
        }
        else {
          auVar32._8_4_ = fVar40;
          auVar32._0_8_ = uVar12;
          auVar32._12_4_ = 0;
          auVar37._8_4_ = fVar45;
          auVar37._0_8_ = uVar2;
          auVar37._12_4_ = 0;
          lVar16 = 0;
          if (uVar13 != 0) {
            for (; (uVar13 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
            }
          }
          uVar3 = *(undefined8 *)(uVar11 + lVar16 * 8);
          fVar46 = local_fe8[lVar16];
          auVar35._8_4_ = fVar46;
          auVar35._0_8_ = uVar3;
          auVar35._12_4_ = 0;
          auVar19._8_4_ = -(uint)((int)fVar40 < (int)fVar45);
          uVar13 = uVar13 - 1 & uVar13;
          if (uVar13 == 0) {
            auVar19._4_4_ = auVar19._8_4_;
            auVar19._0_4_ = auVar19._8_4_;
            auVar19._12_4_ = auVar19._8_4_;
            auVar43._8_4_ = fVar45;
            auVar43._0_8_ = uVar2;
            auVar43._12_4_ = 0;
            auVar55 = blendvps(auVar43,auVar32,auVar19);
            auVar33 = blendvps(auVar32,auVar37,auVar19);
            auVar20._8_4_ = -(uint)(auVar55._8_4_ < (int)fVar46);
            auVar20._4_4_ = auVar20._8_4_;
            auVar20._0_4_ = auVar20._8_4_;
            auVar20._12_4_ = auVar20._8_4_;
            auVar38._8_4_ = fVar46;
            auVar38._0_8_ = uVar3;
            auVar38._12_4_ = 0;
            auVar39 = blendvps(auVar38,auVar55,auVar20);
            auVar44 = blendvps(auVar55,auVar35,auVar20);
            auVar21._8_4_ = -(uint)(auVar33._8_4_ < auVar44._8_4_);
            auVar21._4_4_ = auVar21._8_4_;
            auVar21._0_4_ = auVar21._8_4_;
            auVar21._12_4_ = auVar21._8_4_;
            auVar55 = blendvps(auVar44,auVar33,auVar21);
            auVar33 = blendvps(auVar33,auVar44,auVar21);
            *pauVar17 = auVar33;
            pauVar17[1] = auVar55;
            uVar12 = auVar39._0_8_;
            pauVar17 = pauVar17 + 2;
          }
          else {
            lVar16 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
              }
            }
            auVar22._4_4_ = auVar19._8_4_;
            auVar22._0_4_ = auVar19._8_4_;
            auVar22._8_4_ = auVar19._8_4_;
            auVar22._12_4_ = auVar19._8_4_;
            auVar44 = blendvps(auVar37,auVar32,auVar22);
            auVar33 = blendvps(auVar32,auVar37,auVar22);
            auVar50._8_4_ = local_fe8[lVar16];
            auVar50._0_8_ = *(undefined8 *)(uVar11 + lVar16 * 8);
            auVar50._12_4_ = 0;
            auVar23._8_4_ = -(uint)((int)fVar46 < (int)local_fe8[lVar16]);
            auVar23._4_4_ = auVar23._8_4_;
            auVar23._0_4_ = auVar23._8_4_;
            auVar23._12_4_ = auVar23._8_4_;
            auVar39 = blendvps(auVar50,auVar35,auVar23);
            auVar55 = blendvps(auVar35,auVar50,auVar23);
            auVar24._8_4_ = -(uint)(auVar33._8_4_ < auVar55._8_4_);
            auVar24._4_4_ = auVar24._8_4_;
            auVar24._0_4_ = auVar24._8_4_;
            auVar24._12_4_ = auVar24._8_4_;
            auVar51 = blendvps(auVar55,auVar33,auVar24);
            auVar33 = blendvps(auVar33,auVar55,auVar24);
            auVar25._8_4_ = -(uint)(auVar44._8_4_ < auVar39._8_4_);
            auVar25._4_4_ = auVar25._8_4_;
            auVar25._0_4_ = auVar25._8_4_;
            auVar25._12_4_ = auVar25._8_4_;
            auVar55 = blendvps(auVar39,auVar44,auVar25);
            auVar44 = blendvps(auVar44,auVar39,auVar25);
            auVar26._8_4_ = -(uint)(auVar44._8_4_ < auVar51._8_4_);
            auVar26._4_4_ = auVar26._8_4_;
            auVar26._0_4_ = auVar26._8_4_;
            auVar26._12_4_ = auVar26._8_4_;
            auVar39 = blendvps(auVar51,auVar44,auVar26);
            auVar44 = blendvps(auVar44,auVar51,auVar26);
            *pauVar17 = auVar33;
            pauVar17[1] = auVar44;
            pauVar17[2] = auVar39;
            uVar12 = auVar55._0_8_;
            pauVar17 = pauVar17 + 3;
          }
        }
      }
      goto LAB_00d96cf8;
    }
    if (pauVar17 == (undefined1 (*) [16])&local_f78) {
      return bVar10;
    }
  }
  goto LAB_00d972af;
LAB_00d971c5:
  do {
    local_f80 = uVar12;
    bVar14 = 0;
    lVar15 = 0;
    do {
      if (*(int *)(lVar16 + lVar15 * 4) == -1) break;
      uVar13 = *(uint *)(lVar16 + -0x10 + lVar15 * 4);
      this = (context->scene->geometries).items[uVar13].ptr;
      context->geomID = uVar13;
      context->primID = *(uint *)(lVar16 + lVar15 * 4);
      bVar9 = Geometry::pointQuery(this,query,context);
      bVar14 = bVar14 | bVar9;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 4);
    uVar12 = CONCAT71((int7)(local_f80 >> 8),(byte)local_f80 | bVar14);
    local_f98 = local_f98 + 1;
    lVar16 = lVar16 + 0x50;
  } while (local_f98 != local_f88);
  if ((local_f80 & 1) != 0 || bVar14 != 0) {
    auVar33 = *(undefined1 (*) [16])(context->query_radius).field_0.m128;
    local_fa8 = auVar33._0_4_;
    fStack_fc4 = auVar33._4_4_;
    fStack_fd4 = auVar33._8_4_;
    local_fc8 = fStack_fc4;
    fStack_fc0 = fStack_fc4;
    fStack_fbc = fStack_fc4;
    local_fd8 = fStack_fd4;
    fStack_fd0 = fStack_fd4;
    fStack_fcc = fStack_fd4;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_fb8 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      local_fb8 = dpps(auVar33,auVar33,0x7f);
    }
    bVar10 = true;
    fStack_fa4 = local_fa8;
    fStack_fa0 = local_fa8;
    fStack_f9c = local_fa8;
  }
LAB_00d972af:
  fVar27 = local_fa8 * local_fa8;
  fVar28 = fStack_fa4 * fStack_fa4;
  fVar29 = fStack_fa0 * fStack_fa0;
  fVar30 = fStack_f9c * fStack_f9c;
  if (pauVar17 == (undefined1 (*) [16])&local_f78) {
    return bVar10;
  }
  goto LAB_00d96c9c;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }